

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandStarted
          (BuildSystemFrontendDelegate *this,Command *command)

{
  FILE *__stream;
  int iVar1;
  _func_int **pp_Var2;
  char *pcVar3;
  SmallString<64U> description;
  SmallString<64U> local_68;
  
  iVar1 = (*(command->super_JobDescriptor)._vptr_JobDescriptor[5])(command);
  if ((char)iVar1 == '\0') {
    return;
  }
  local_68.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_68.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>;
  local_68.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_68.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  pp_Var2 = (command->super_JobDescriptor)._vptr_JobDescriptor;
  if (*(char *)(*(long *)(*(long *)((long)this->impl + 0x30) + 0x10) + 2) == '\0') {
    (*pp_Var2[3])(command,&local_68);
    if (local_68.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size != 0) goto LAB_0015c4ad;
    pp_Var2 = (command->super_JobDescriptor)._vptr_JobDescriptor;
  }
  (*pp_Var2[4])(command,&local_68);
LAB_0015c4ad:
  __stream = _stdout;
  pcVar3 = llvm::SmallString<64U>::c_str(&local_68);
  fprintf(__stream,"%s\n",pcVar3);
  fflush(_stdout);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_68);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandStarted(Command* command) {
  // Don't report status if opted out by the command.
  if (!command->shouldShowStatus()) {
    return;
  }

  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);

  // Log the command.
  //
  // FIXME: Design the logging and status output APIs.
  SmallString<64> description;
  if (impl->frontend->invocation.showVerboseStatus) {
    command->getVerboseDescription(description);
  } else {
    command->getShortDescription(description);

    // If the short description is empty, always show the verbose one.
    if (description.empty()) {
      command->getVerboseDescription(description);
    }
  }
  fprintf(stdout, "%s\n", description.c_str());
  fflush(stdout);
}